

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall pbrt::Sphere::readFrom(Sphere *this,BinaryReader *binary)

{
  Shape *in_RSI;
  BinaryReader *in_RDI;
  
  Shape::readFrom(in_RSI,in_RDI);
  BinaryReader::read<float,void>((BinaryReader *)in_RSI,(float *)in_RDI);
  BinaryReader::read<pbrt::math::affine3f,void>((BinaryReader *)in_RSI,(affine3f *)in_RDI);
  return;
}

Assistant:

void Sphere::readFrom(BinaryReader &binary) 
  {
    Shape::readFrom(binary);
    binary.read(radius);
    binary.read(transform);
  }